

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignerInfo.c
# Opt level: O1

_Bool COSE_Signer_Free(HCOSE_SIGNER hSigner)

{
  _Bool _Var1;
  COSE_SignerInfo *p;
  
  _Var1 = _COSE_IsInList(SignerRoot,(COSE *)hSigner);
  if (_Var1) {
    if (*(int *)(hSigner + 0x10) < 2) {
      _COSE_Release((COSE *)hSigner);
      _COSE_RemoveFromList(&SignerRoot,(COSE *)hSigner);
      free(hSigner);
    }
    else {
      *(int *)(hSigner + 0x10) = *(int *)(hSigner + 0x10) + -1;
      _Var1 = true;
    }
  }
  return _Var1;
}

Assistant:

bool COSE_Signer_Free(HCOSE_SIGNER hSigner)
{
	COSE_SignerInfo * pSigner = (COSE_SignerInfo *)hSigner;
	bool fRet = false;

	if (!IsValidSignerHandle(hSigner)) goto errorReturn;

	if (pSigner->m_message.m_refCount > 1) {
		pSigner->m_message.m_refCount--;
		return true;
	}

	_COSE_SignerInfo_Free(pSigner);

	_COSE_RemoveFromList(&SignerRoot, &pSigner->m_message);

	COSE_FREE(pSigner, &pSigner->m_message.m_allocContext);

	fRet = true;
errorReturn:
	return fRet;
}